

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostkey.c
# Opt level: O0

int hostkey_method_ssh_ed25519_initPEM
              (LIBSSH2_SESSION *session,char *privkeyfile,uchar *passphrase,void **abstract)

{
  int iVar1;
  EVP_PKEY *pEStack_38;
  int ret;
  EVP_PKEY *ec_ctx;
  void **abstract_local;
  uchar *passphrase_local;
  char *privkeyfile_local;
  LIBSSH2_SESSION *session_local;
  
  pEStack_38 = (EVP_PKEY *)0x0;
  ec_ctx = (EVP_PKEY *)abstract;
  abstract_local = (void **)passphrase;
  passphrase_local = (uchar *)privkeyfile;
  privkeyfile_local = (char *)session;
  if (*abstract != (void *)0x0) {
    hostkey_method_ssh_ed25519_dtor(session,abstract);
    *(undefined8 *)ec_ctx = 0;
  }
  iVar1 = _libssh2_ed25519_new_private
                    (&stack0xffffffffffffffc8,(LIBSSH2_SESSION *)privkeyfile_local,
                     (char *)passphrase_local,(uint8_t *)abstract_local);
  if (iVar1 == 0) {
    *(EVP_PKEY **)ec_ctx = pEStack_38;
    session_local._4_4_ = 0;
  }
  else {
    session_local._4_4_ = -1;
  }
  return session_local._4_4_;
}

Assistant:

static int
hostkey_method_ssh_ed25519_initPEM(LIBSSH2_SESSION * session,
                                   const char *privkeyfile,
                                   unsigned const char *passphrase,
                                   void **abstract)
{
    libssh2_ed25519_ctx *ec_ctx = NULL;
    int ret;

    if(*abstract) {
        hostkey_method_ssh_ed25519_dtor(session, abstract);
        *abstract = NULL;
    }

    ret = _libssh2_ed25519_new_private(&ec_ctx, session,
                                       privkeyfile, passphrase);
    if(ret) {
        return -1;
    }

    *abstract = ec_ctx;

    return ret;
}